

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O3

void pzshape::TPZShapeTetra::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  long local_40;
  
  lVar11 = 4;
  local_40 = 0x20;
  do {
    if (0 < nshape->fStore[lVar11 + -4]) {
      iVar7 = (int)lVar11;
      iVar6 = pztopology::TPZTetrahedron::NSideNodes(iVar7);
      if (iVar6 == 4) {
        dVar16 = *(double *)(&DAT_01527460 + lVar11 * 8);
        lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar9 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1 = phi->fElem;
        if (lVar9 < 2) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar9 < 3) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar9 < 4) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar9 <= lVar11) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar1[lVar11] = *pdVar1 * dVar16 * pdVar1[1] * pdVar1[2] * pdVar1[3];
        lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar15 = 0;
        do {
          if ((lVar9 <= lVar15) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar9 < 2) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          if (lVar9 < 3) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar9 < 4) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar13 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar13 <= lVar15) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2))
          {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar9 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar5 = phi->fElem;
          if (lVar9 < 4) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar9 < 1) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar9 < 2) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar14 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar14 <= lVar15) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3))
          {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar9 < 4) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar12 = phi->fElem;
          if (lVar9 < 1) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar9 < 2) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar9 < 3) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
          if (lVar4 < 4 || lVar9 <= lVar15) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((lVar9 <= lVar15) || (lVar4 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(double *)((long)dphi->fElem + lVar15 * 8 + local_40 * lVar9) =
               (*pdVar12 * pdVar12[1] * pdVar12[2] * dphi->fElem[lVar9 * 3 + lVar15] +
               *pdVar5 * pdVar5[1] * dphi->fElem[lVar14 * 2 + lVar15] * pdVar12[3] +
               dphi->fElem[lVar15] * pdVar1[1] * pdVar1[2] * pdVar1[3] +
               *pdVar1 * dphi->fElem[lVar13 + lVar15] * pdVar5[2] * pdVar5[3]) * dVar16;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
      }
      else {
        if (iVar6 == 3) {
          iVar6 = pztopology::TPZTetrahedron::SideNodeLocId(iVar7,0);
          iVar8 = pztopology::TPZTetrahedron::SideNodeLocId(iVar7,1);
          iVar7 = pztopology::TPZTetrahedron::SideNodeLocId(iVar7,2);
          dVar16 = *(double *)(&DAT_01527460 + lVar11 * 8);
          lVar9 = (long)iVar6;
          if (((iVar6 < 0) ||
              (lVar15 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar15 <= lVar9))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          lVar13 = (long)iVar8;
          if ((iVar8 < 0) || (lVar15 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar14 = (long)iVar7;
          if ((iVar7 < 0) || (lVar15 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar15 <= lVar11) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1[lVar11] = pdVar1[lVar9] * dVar16 * pdVar1[lVar13] * pdVar1[lVar14];
          lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar15 < 1) || (iVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar8 < 0) ||
              (lVar4 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar4 <= lVar13)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          if ((iVar7 < 0) || (lVar4 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar6 < 0) || (lVar4 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar4 < 1) || (iVar8 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar7 < 0) ||
              (lVar10 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar10 <= lVar14))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar5 = phi->fElem;
          if ((iVar6 < 0) || (lVar10 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar8 < 0) || (lVar10 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar10 < 1) ||
             (lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             iVar7 < 0 || lVar2 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar12 = dphi->fElem;
          if ((lVar10 < 1) || (lVar2 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar12[lVar10 * lVar11] =
               (pdVar5[lVar9] * pdVar5[lVar13] * pdVar12[lVar10 * lVar14] +
               dphi->fElem[lVar15 * lVar9] * pdVar1[lVar13] * pdVar1[lVar14] +
               pdVar1[lVar9] * dphi->fElem[lVar4 * lVar13] * pdVar5[lVar14]) * dVar16;
          if (((lVar10 < 2) || (iVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar8 < 0) ||
              (lVar15 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar15 <= lVar13))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          if ((iVar7 < 0) || (lVar15 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar6 < 0) || (lVar15 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar15 < 2) || (iVar8 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar7 < 0) ||
              (lVar4 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar4 <= lVar14)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar5 = phi->fElem;
          if ((iVar6 < 0) || (lVar4 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar8 < 0) || (lVar4 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar4 < 2) ||
             (lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             iVar7 < 0 || lVar2 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar3 = dphi->fElem;
          if ((lVar4 < 2) || (lVar2 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar3[lVar4 * lVar11 + 1] =
               (pdVar5[lVar9] * pdVar5[lVar13] * pdVar3[lVar4 * lVar14 + 1] +
               pdVar12[lVar10 * lVar9 + 1] * pdVar1[lVar13] * pdVar1[lVar14] +
               pdVar1[lVar9] * dphi->fElem[lVar15 * lVar13 + 1] * pdVar5[lVar14]) * dVar16;
          if (((lVar4 < 3) || (iVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar8 < 0) ||
              (lVar15 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar15 <= lVar13))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          if ((iVar7 < 0) || (lVar15 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar6 < 0) || (lVar15 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar15 < 3) || (iVar8 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar7 < 0) ||
              (lVar10 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar10 <= lVar14))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar5 = phi->fElem;
          if ((iVar6 < 0) || (lVar10 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar8 < 0) || (lVar10 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar10 < 3) ||
             (lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             iVar7 < 0 || lVar2 <= lVar14)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar12 = dphi->fElem;
          if ((lVar10 < 3) || (lVar2 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar17 = pdVar5[lVar9] * pdVar5[lVar13] * pdVar12[lVar14 * lVar10 + 2] +
                   pdVar3[lVar4 * lVar9 + 2] * pdVar1[lVar13] * pdVar1[lVar14] +
                   pdVar1[lVar9] * dphi->fElem[lVar15 * lVar13 + 2] * pdVar5[lVar14];
        }
        else {
          if (iVar6 != 2) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                       ,0xd4);
          }
          iVar6 = pztopology::TPZTetrahedron::SideNodeLocId(iVar7,0);
          iVar7 = pztopology::TPZTetrahedron::SideNodeLocId(iVar7,1);
          dVar16 = *(double *)(&DAT_01527460 + lVar11 * 8);
          lVar9 = (long)iVar6;
          if (((iVar6 < 0) ||
              (lVar15 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar15 <= lVar9))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = phi->fElem;
          lVar13 = (long)iVar7;
          if ((iVar7 < 0) || (lVar15 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (lVar15 <= lVar11) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1[lVar11] = pdVar1[lVar9] * dVar16 * pdVar1[lVar13];
          lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if (((lVar15 < 1) || (iVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar7 < 0) ||
              (lVar14 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar14 <= lVar13))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar6 < 0) || (lVar14 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar14 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar14 < 1) ||
             (lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             iVar7 < 0 || lVar4 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1 = dphi->fElem;
          if ((lVar14 < 1) || (lVar4 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar1[lVar14 * lVar11] =
               (dphi->fElem[lVar15 * lVar9] * phi->fElem[lVar13] +
               phi->fElem[lVar9] * pdVar1[lVar14 * lVar13]) * dVar16;
          if (((lVar14 < 2) || (iVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar7 < 0) ||
              (lVar15 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar15 <= lVar13))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar6 < 0) || (lVar15 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar15 < 2) ||
             (lVar4 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             iVar7 < 0 || lVar4 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar5 = dphi->fElem;
          if ((lVar15 < 2) || (lVar4 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar5[lVar15 * lVar11 + 1] =
               (pdVar1[lVar14 * lVar9 + 1] * phi->fElem[lVar13] +
               phi->fElem[lVar9] * pdVar5[lVar15 * lVar13 + 1]) * dVar16;
          if (((lVar15 < 3) || (iVar6 < 0)) ||
             ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((iVar7 < 0) ||
              (lVar14 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar14 <= lVar13))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((iVar6 < 0) || (lVar14 <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar10 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar10 < 3) ||
             (lVar14 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             iVar7 < 0 || lVar14 <= lVar13)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar12 = dphi->fElem;
          if ((lVar10 < 3) || (lVar14 <= lVar11)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar17 = pdVar5[lVar15 * lVar9 + 2] * phi->fElem[lVar13] +
                   phi->fElem[lVar9] * pdVar12[lVar13 * lVar10 + 2];
        }
        pdVar12[lVar10 * lVar11 + 2] = dVar16 * dVar17;
      }
    }
    lVar11 = lVar11 + 1;
    local_40 = local_40 + 8;
    if (lVar11 == 0xf) {
      return;
    }
  } while( true );
}

Assistant:

void TPZShapeTetra::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
    REAL mult[] = {1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,27.,27.,27.,27.,54.};

    // 6 ribs
    for(int is=4; is<NSides; is++)
    {
        if(nshape[is-4] < 1) continue;
        int nsnodes = NSideNodes(is);
        switch(nsnodes)
        {
            case 2:
            {
                int is1 = SideNodeLocId(is,0);
                int is2 = SideNodeLocId(is,1);
                phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0);
                dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2));
                dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2));
                dphi(2,is) = mult[is]*(dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2));
            }
                break;
            case 3:
            {
                //int face = is-10;
                int is1 = SideNodeLocId(is,0); //ShapeFaceId[face][0];
                int is2 = SideNodeLocId(is,1); //ShapeFaceId[face][1];
                int is3 = SideNodeLocId(is,2); //ShapeFaceId[face][2];
                phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0)*phi(is3,0);
                dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3));
                dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3));
                dphi(2,is) = mult[is]*(dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3));
            }
                break;
            case 4:
            {
                phi(is,0) = mult[is]*phi(0,0)*phi(1,0)*phi(2,0)*phi(3,0);
                for(int xj=0;xj<3;xj++) {
                    dphi(xj,is) = mult[is]*(dphi(xj,0)* phi(1 ,0)* phi(2 ,0)* phi(3 ,0) +
                    phi(0, 0)*dphi(xj,1)* phi(2 ,0)* phi(3 ,0) +
                    phi(0, 0)* phi(1 ,0)*dphi(xj,2)* phi(3 ,0) +
                    phi(0, 0)* phi(1 ,0)* phi(2 ,0)*dphi(xj,3));
                }
            }
                break;
                
            default:
                DebugStop();
        }
    }     
}